

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

void call_handler(JSContext *ctx,JSValue func)

{
  int iVar1;
  JSValueUnion JVar2;
  JSRefCountHeader *p;
  JSValue v;
  
  JVar2 = func.u;
  if ((uint)func.tag < 0xfffffff5) {
    v = JS_Call(ctx,func,(JSValue)(ZEXT816(3) << 0x40),0,(JSValue *)0x0);
  }
  else {
    *(int *)JVar2.ptr = *JVar2.ptr + 1;
    v = JS_Call(ctx,func,(JSValue)(ZEXT816(3) << 0x40),0,(JSValue *)0x0);
    iVar1 = *JVar2.ptr;
    *(int *)JVar2.ptr = iVar1 + -1;
    if (iVar1 < 2) {
      __JS_FreeValue(ctx,func);
    }
  }
  if ((uint)v.tag == 6) {
    js_std_dump_error(ctx);
  }
  if ((0xfffffff4 < (uint)v.tag) && (iVar1 = *v.u.ptr, *(int *)v.u.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValue(ctx,v);
    return;
  }
  return;
}

Assistant:

static void call_handler(JSContext *ctx, JSValueConst func)
{
    JSValue ret, func1;
    /* 'func' might be destroyed when calling itself (if it frees the
       handler), so must take extra care */
    func1 = JS_DupValue(ctx, func);
    ret = JS_Call(ctx, func1, JS_UNDEFINED, 0, NULL);
    JS_FreeValue(ctx, func1);
    if (JS_IsException(ret))
        js_std_dump_error(ctx);
    JS_FreeValue(ctx, ret);
}